

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::mousePressEvent(Stepper *this,QMouseEvent *event)

{
  StepperPrivate *pSVar1;
  Button BVar2;
  QMouseEvent QVar3;
  QPoint local_28;
  
  if (*(int *)(event + 0x40) == 1) {
    QTimer::stop();
    pSVar1 = (this->d).d;
    pSVar1->timeout = 500;
    pSVar1->autorepeatCount = 0;
    local_28 = QMouseEvent::pos(event);
    BVar2 = StepperPrivate::buttonPressed(pSVar1,&local_28);
    pSVar1 = (this->d).d;
    pSVar1->button = BVar2;
    StepperPrivate::makeClick(pSVar1);
    pSVar1 = (this->d).d;
    QVar3 = (QMouseEvent)0x1;
    if (pSVar1->autorepeat == true) {
      QTimer::start((int)pSVar1->timer);
    }
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar3;
  return;
}

Assistant:

void
Stepper::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->timer->stop();

		d->autorepeatCount = 0;
		d->timeout = defaultTimeout;

		d->button = d->buttonPressed( event->pos() );

		d->makeClick();

		if( d->autorepeat )
			d->timer->start( d->timeout );

		event->accept();
	}
	else
		event->ignore();
}